

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_medium.c
# Opt level: O0

block_state deflate_medium(deflate_state *s,int flush)

{
  bool bVar1;
  match match;
  uint16_t uVar2;
  Pos PVar3;
  uint32_t uVar4;
  int iVar5;
  long lVar6;
  int in_ESI;
  deflate_state *in_RDI;
  bool bVar7;
  int64_t dist;
  int bflush;
  Pos hash_head;
  int early_exit;
  match next_match;
  match current_match;
  deflate_state *in_stack_ffffffffffffff78;
  match in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar8;
  deflate_state *in_stack_ffffffffffffffa0;
  ushort local_36;
  match local_30;
  match local_28 [2];
  int local_14;
  deflate_state *local_10;
  
  bVar1 = in_RDI->level < 5;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_28,0,8);
  memset(&local_30,0,8);
  do {
    if (local_10->lookahead < 0x106) {
      zng_fill_window((deflate_state *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                     );
      if ((local_10->lookahead < 0x106) && (local_14 == 0)) {
        return need_more;
      }
      if (local_10->lookahead == 0) {
        if (local_10->strstart < 2) {
          uVar8 = local_10->strstart;
        }
        else {
          uVar8 = 2;
        }
        local_10->insert = uVar8;
        if (local_14 != 4) {
          if (local_10->sym_next != 0) {
            zng_tr_flush_block(in_stack_ffffffffffffffa0,
                               (char *)CONCAT44(uVar8,in_stack_ffffffffffffff98),
                               in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
            local_10->block_start = local_10->strstart;
            zng_flush_pending((zng_stream *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
            if (local_10->strm->avail_out == 0) {
              return need_more;
            }
          }
          return block_done;
        }
        iVar5 = (int)local_10;
        uVar4 = (uint32_t)((ulong)local_10 >> 0x20);
        zng_tr_flush_block(in_stack_ffffffffffffffa0,
                           (char *)CONCAT44(uVar8,in_stack_ffffffffffffff98),uVar4,iVar5);
        local_10->block_start = local_10->strstart;
        zng_flush_pending((zng_stream *)CONCAT44(uVar4,iVar5));
        if (local_10->strm->avail_out == 0) {
          return finish_started;
        }
        return finish_done;
      }
      local_30.match_length = 0;
    }
    if ((bVar1) || (local_30.match_length == 0)) {
      local_36 = 0;
      if (3 < local_10->lookahead) {
        local_36 = quick_insert_string((deflate_state *)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,in_stack_ffffffffffffff8c);
      }
      uVar2 = (uint16_t)local_10->strstart;
      local_28[0].strstart = uVar2;
      local_28[0].orgstart = uVar2;
      lVar6 = (ulong)local_10->strstart - (ulong)local_36;
      if ((((long)(ulong)(local_10->w_size - 0x106) < lVar6) || (lVar6 < 1)) || (local_36 == 0)) {
        local_28[0].match_start = 0;
        local_28[0].match_length = 1;
      }
      else {
        uVar4 = (*functable.longest_match)(local_10,local_36);
        local_28[0].match_length = (ushort)uVar4;
        local_28[0].match_start = (uint16_t)local_10->match_start;
        if ((ushort)uVar4 < 4) {
          local_28[0].match_length = 1;
        }
        if (local_28[0].strstart <= local_28[0].match_start) {
          local_28[0].match_length = 1;
        }
      }
    }
    else {
      local_28[0].match_length = local_30.match_length;
      local_28[0].match_start = local_30.match_start;
      local_28[0].strstart = local_30.strstart;
      local_28[0].orgstart = local_30.orgstart;
      local_30.match_length = 0;
    }
    insert_match(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    bVar7 = false;
    if ((!bVar1) && (bVar7 = false, 0x106 < local_10->lookahead)) {
      bVar7 = (uint)local_28[0].strstart + (uint)local_28[0].match_length <
              local_10->window_size - 0x106;
    }
    if (bVar7) {
      local_10->strstart = (uint)local_28[0].strstart + (uint)local_28[0].match_length;
      PVar3 = quick_insert_string((deflate_state *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                  in_stack_ffffffffffffff8c);
      local_30.strstart = (uint16_t)local_10->strstart;
      lVar6 = (ulong)local_10->strstart - (ulong)PVar3;
      local_30.orgstart = local_30.strstart;
      if ((((long)(ulong)(local_10->w_size - 0x106) < lVar6) || (lVar6 < 1)) || (PVar3 == 0)) {
        local_30.match_start = 0;
        local_30.match_length = 1;
      }
      else {
        uVar4 = (*functable.longest_match)(local_10,PVar3);
        local_30.match_length = (uint16_t)uVar4;
        local_30.match_start = (uint16_t)local_10->match_start;
        if ((uint)local_30.strstart <= (local_10->match_start & 0xffff)) {
          local_30.match_length = 1;
        }
        if (local_30.match_length < 4) {
          local_30.match_length = 1;
        }
        else {
          fizzle_matches(local_10,local_28,&local_30);
        }
      }
      local_10->strstart = (uint)local_28[0].strstart;
    }
    else {
      local_30.match_length = 0;
    }
    match.strstart = (short)in_stack_ffffffffffffff90;
    match.orgstart = (short)((uint)in_stack_ffffffffffffff90 >> 0x10);
    match.match_start = (short)in_stack_ffffffffffffff8c;
    match.match_length = (short)(in_stack_ffffffffffffff8c >> 0x10);
    iVar5 = emit_match((deflate_state *)in_stack_ffffffffffffff80,match);
    local_10->strstart = (uint)local_28[0].match_length + local_10->strstart;
    if (iVar5 != 0) {
      if (local_10->block_start < 0) {
        in_stack_ffffffffffffffa0 = (deflate_state *)0x0;
      }
      else {
        in_stack_ffffffffffffffa0 =
             (deflate_state *)(local_10->window + (uint)local_10->block_start);
      }
      zng_tr_flush_block(in_stack_ffffffffffffffa0,
                         (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      local_10->block_start = local_10->strstart;
      zng_flush_pending((zng_stream *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
      ;
      if (local_10->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_medium(deflate_state *s, int flush) {
    /* Align the first struct to start on a new cacheline, this allows us to fit both structs in one cacheline */
    ALIGNED_(16) struct match current_match;
                 struct match next_match;

    /* For levels below 5, don't check the next position for a better match */
    int early_exit = s->level < 5;

    memset(&current_match, 0, sizeof(struct match));
    memset(&next_match, 0, sizeof(struct match));

    for (;;) {
        Pos hash_head = 0;    /* head of the hash chain */
        int bflush = 0;       /* set if current block must be flushed */
        int64_t dist;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next current_match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
            next_match.match_length = 0;
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */

        /* If we already have a future match from a previous round, just use that */
        if (!early_exit && next_match.match_length > 0) {
            current_match = next_match;
            next_match.match_length = 0;
        } else {
            hash_head = 0;
            if (s->lookahead >= WANT_MIN_MATCH) {
                hash_head = quick_insert_string(s, s->strstart);
            }

            current_match.strstart = (uint16_t)s->strstart;
            current_match.orgstart = current_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                current_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                current_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(current_match.match_length < WANT_MIN_MATCH))
                    current_match.match_length = 1;
                if (UNLIKELY(current_match.match_start >= current_match.strstart)) {
                    /* this can happen due to some restarts */
                    current_match.match_length = 1;
                }
            } else {
                /* Set up the match to be a 1 byte literal */
                current_match.match_start = 0;
                current_match.match_length = 1;
            }
        }

        insert_match(s, current_match);

        /* now, look ahead one */
        if (LIKELY(!early_exit && s->lookahead > MIN_LOOKAHEAD && (uint32_t)(current_match.strstart + current_match.match_length) < (s->window_size - MIN_LOOKAHEAD))) {
            s->strstart = current_match.strstart + current_match.match_length;
            hash_head = quick_insert_string(s, s->strstart);

            next_match.strstart = (uint16_t)s->strstart;
            next_match.orgstart = next_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                next_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                next_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(next_match.match_start >= next_match.strstart)) {
                    /* this can happen due to some restarts */
                    next_match.match_length = 1;
                }
                if (next_match.match_length < WANT_MIN_MATCH)
                    next_match.match_length = 1;
                else
                    fizzle_matches(s, &current_match, &next_match);
            } else {
                /* Set up the match to be a 1 byte literal */
                next_match.match_start = 0;
                next_match.match_length = 1;
            }

            s->strstart = current_match.strstart;
        } else {
            next_match.match_length = 0;
        }

        /* now emit the current match */
        bflush = emit_match(s, current_match);

        /* move the "cursor" forward */
        s->strstart += current_match.match_length;

        if (UNLIKELY(bflush))
            FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);

    return block_done;
}